

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Return_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Return_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
             ,Dispatch_State *t_ss)

{
  Type_Conversions *pTVar1;
  Type_Conversions *pTVar2;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this_00;
  
  pTVar1 = t_ss[2].m_conversions.m_conversions._M_data;
  pTVar2 = (Type_Conversions *)t_ss[2].m_conversions.m_saves._M_data;
  this_00 = (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
            __cxa_allocate_exception(0x10);
  if (pTVar1 == pTVar2) {
    void_var();
  }
  else {
    AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
              (this_00,*(Dispatch_State **)t_ss[2].m_conversions.m_conversions._M_data);
  }
  __cxa_throw(this_00,&detail::Return_Value::typeinfo,detail::Return_Value::~Return_Value);
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        if (!this->children.empty()) {
          throw detail::Return_Value{this->children[0]->eval(t_ss)};
        } else {
          throw detail::Return_Value{void_var()};
        }
      }